

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

void ucnv_MBCSGetStarters(UConverter *cnv,UBool *starters,UErrorCode *param_3)

{
  byte bVar1;
  int32_t (*paiVar2) [256];
  int local_2c;
  int i;
  int32_t *state0;
  UErrorCode *param_2_local;
  UBool *starters_local;
  UConverter *cnv_local;
  
  paiVar2 = (cnv->sharedData->mbcs).stateTable;
  bVar1 = (cnv->sharedData->mbcs).dbcsOnlyState;
  for (local_2c = 0; local_2c < 0x100; local_2c = local_2c + 1) {
    starters[local_2c] = -1 < paiVar2[bVar1][local_2c];
  }
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSGetStarters(const UConverter* cnv,
                 UBool starters[256],
                 UErrorCode *) {
    const int32_t *state0;
    int i;

    state0=cnv->sharedData->mbcs.stateTable[cnv->sharedData->mbcs.dbcsOnlyState];
    for(i=0; i<256; ++i) {
        /* all bytes that cause a state transition from state 0 are lead bytes */
        starters[i]= (UBool)MBCS_ENTRY_IS_TRANSITION(state0[i]);
    }
}